

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_authentication(connectdata *conn)

{
  pop3state local_48;
  pop3state local_44;
  pop3state state2;
  pop3state state1;
  size_t len;
  char *initresp;
  char *mech;
  pop3_conn *pop3c;
  connectdata *pcStack_18;
  CURLcode result;
  connectdata *conn_local;
  
  pop3c._4_4_ = CURLE_OK;
  mech = (char *)&conn->proto;
  initresp = (char *)0x0;
  len = 0;
  _state2 = 0;
  local_44 = POP3_STOP;
  local_48 = POP3_STOP;
  pcStack_18 = conn;
  if (((conn->bits).user_passwd & 1U) == 0) {
    state(conn,POP3_STOP);
    conn_local._4_4_ = pop3c._4_4_;
  }
  else {
    if (((conn->proto).pop3c.authtypes & 4) != 0) {
      pop3c._4_4_ = pop3_calc_sasl_details
                              (conn,&initresp,(char **)&len,(size_t *)&state2,&local_44,&local_48);
    }
    if (pop3c._4_4_ == CURLE_OK) {
      if ((initresp == (char *)0x0) || ((*(uint *)(mech + 0x90) & 4) == 0)) {
        if (((*(uint *)(mech + 0x88) & 2) == 0) || ((*(uint *)(mech + 0x90) & 2) == 0)) {
          if (((*(uint *)(mech + 0x88) & 1) == 0) || ((*(uint *)(mech + 0x90) & 1) == 0)) {
            Curl_infof(pcStack_18->data,"No known authentication mechanisms supported!\n");
            pop3c._4_4_ = CURLE_LOGIN_DENIED;
          }
          else {
            pop3c._4_4_ = pop3_perform_user(pcStack_18);
          }
        }
        else {
          pop3c._4_4_ = pop3_perform_apop(pcStack_18);
        }
      }
      else {
        pop3c._4_4_ = pop3_perform_auth(pcStack_18,initresp,(char *)len,_state2,local_44,local_48);
        if (len != 0) {
          (*Curl_cfree)((void *)len);
        }
      }
    }
    conn_local._4_4_ = pop3c._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_perform_authentication(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  const char *mech = NULL;
  char *initresp = NULL;
  size_t len = 0;
  pop3state state1 = POP3_STOP;
  pop3state state2 = POP3_STOP;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Calculate the SASL login details */
  if(pop3c->authtypes & POP3_TYPE_SASL)
    result = pop3_calc_sasl_details(conn, &mech, &initresp, &len, &state1,
                                    &state2);

  if(!result) {
    if(mech && (pop3c->preftype & POP3_TYPE_SASL)) {
      /* Perform SASL based authentication */
      result = pop3_perform_auth(conn, mech, initresp, len, state1, state2);

      Curl_safefree(initresp);
    }
#ifndef CURL_DISABLE_CRYPTO_AUTH
    else if((pop3c->authtypes & POP3_TYPE_APOP) &&
            (pop3c->preftype & POP3_TYPE_APOP))
      /* Perform APOP authentication */
      result = pop3_perform_apop(conn);
#endif
    else if((pop3c->authtypes & POP3_TYPE_CLEARTEXT) &&
            (pop3c->preftype & POP3_TYPE_CLEARTEXT))
      /* Perform clear text authentication */
      result = pop3_perform_user(conn);
    else {
      /* Other mechanisms not supported */
      infof(conn->data, "No known authentication mechanisms supported!\n");
      result = CURLE_LOGIN_DENIED;
    }
  }

  return result;
}